

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  bool bVar1;
  reference pcVar2;
  char chr;
  string local_1d0;
  char local_1a9;
  const_iterator cStack_1a8;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream os;
  string *txt_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (txt);
  cStack_1a8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         (txt);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end1,&stack0xfffffffffffffe58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_1a9 = *pcVar2;
    transformed_abi_cxx11_(&local_1d0,(lest *)(ulong)(uint)(int)local_1a9,chr);
    std::operator<<((ostream *)&__range1,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt ) { std::ostringstream os; for(auto c:txt) os << transformed(c); return os.str(); }